

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O3

void __thiscall OpenMD::VectorAccumulator::getStdDev(VectorAccumulator *this,ResultType *ret)

{
  uint i;
  long lVar1;
  double dVar2;
  double dVar3;
  ResultType var;
  double local_28 [4];
  
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  local_28[2] = 0.0;
  lVar1 = 0;
  do {
    dVar2 = (this->Avg_).super_Vector<double,_3U>.data_[lVar1];
    dVar3 = (this->Avg2_).super_Vector<double,_3U>.data_[lVar1] - dVar2 * dVar2;
    dVar2 = 0.0;
    if (0.0 <= dVar3) {
      dVar2 = dVar3;
    }
    local_28[lVar1] = dVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (local_28[0] < 0.0) {
    dVar2 = sqrt(local_28[0]);
  }
  else {
    dVar2 = SQRT(local_28[0]);
  }
  (ret->super_Vector<double,_3U>).data_[0] = dVar2;
  if (local_28[1] < 0.0) {
    dVar2 = sqrt(local_28[1]);
  }
  else {
    dVar2 = SQRT(local_28[1]);
  }
  (ret->super_Vector<double,_3U>).data_[1] = dVar2;
  if (local_28[2] < 0.0) {
    local_28[2] = sqrt(local_28[2]);
  }
  else {
    local_28[2] = SQRT(local_28[2]);
  }
  (ret->super_Vector<double,_3U>).data_[2] = local_28[2];
  return;
}

Assistant:

void getStdDev(ResultType& ret) {
      assert(Count_ != 0);
      ResultType var;
      this->getVariance(var);
      ret[0] = sqrt(var[0]);
      ret[1] = sqrt(var[1]);
      ret[2] = sqrt(var[2]);
      return;
    }